

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-format.hh
# Opt level: O2

string * __thiscall
tinyusdz::crate::ValueRep::GetStringRepr_abi_cxx11_(string *__return_storage_ptr__,ValueRep *this)

{
  ostream *poVar1;
  int32_t type_id;
  stringstream ss;
  string local_1d0;
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  
  ::std::__cxx11::stringstream::stringstream(local_1b0);
  poVar1 = ::std::operator<<(local_1a0,"ty: ");
  poVar1 = (ostream *)::std::ostream::operator<<(poVar1,(uint)*(byte *)((long)&this->data + 6));
  poVar1 = ::std::operator<<(poVar1,"(");
  GetCrateDataTypeName_abi_cxx11_
            (&local_1d0,(crate *)(ulong)*(byte *)((long)&this->data + 6),type_id);
  poVar1 = ::std::operator<<(poVar1,(string *)&local_1d0);
  poVar1 = ::std::operator<<(poVar1,"), isArray: ");
  poVar1 = ::std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  poVar1 = ::std::operator<<(poVar1,", isInlined: ");
  poVar1 = ::std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  poVar1 = ::std::operator<<(poVar1,", isCompressed: ");
  poVar1 = ::std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  poVar1 = ::std::operator<<(poVar1,", payload: ");
  ::std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

std::string GetStringRepr() const {
    std::stringstream ss;
    ss << "ty: " << static_cast<int>(GetType()) << "(" << GetCrateDataTypeName(GetType()) << "), isArray: " << IsArray()
       << ", isInlined: " << IsInlined() << ", isCompressed: " << IsCompressed()
       << ", payload: " << GetPayload();

    return ss.str();
  }